

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O0

bool __thiscall
AugmentedMatrix::setMatrixData(AugmentedMatrix *this,fraction *valves,int width,int height)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  int j;
  fraction *x;
  int i;
  undefined4 local_2c;
  undefined4 local_1c;
  
  *(undefined4 *)(in_RDI + 0x300) = in_EDX;
  *(undefined4 *)(in_RDI + 0x304) = in_ECX;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x304); local_1c = local_1c + 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 0x300);
    uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x300); local_2c = local_2c + 1) {
      *(unkbyte10 *)((long)pvVar3 + (long)local_2c * 0x10) =
           *(unkbyte10 *)(in_RSI + (long)(local_1c * *(int *)(in_RDI + 0x300) + local_2c) * 0x10);
    }
    *(void **)(in_RDI + (long)local_1c * 8) = pvVar3;
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setMatrixData(fraction *valves , int width, int height)
{
    this->width = width;
    this->height = height;

    for(int i=0 ; i<this->height ; i++)
    {
        fraction *x = new fraction[this->width];
        for(int j=0 ; j<this->width ; j++)
            x[j] = valves[i*this->width + j];
        matrix[i] = x;
    }

    return true;
}